

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int wait_frame_inner(amqp_connection_state_t state,amqp_frame_t *decoded_frame,
                    amqp_time_t timeout_deadline)

{
  amqp_boolean_t aVar1;
  int iVar2;
  amqp_time_t aVar3;
  amqp_time_t l;
  amqp_time_t in_RDX;
  char *in_RSI;
  amqp_connection_state_t in_RDI;
  amqp_frame_t heartbeat;
  int res;
  amqp_time_t deadline;
  undefined4 in_stack_ffffffffffffff88;
  amqp_socket_close_enum in_stack_ffffffffffffff8c;
  amqp_time_t in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined2 in_stack_ffffffffffffffa2;
  undefined4 in_stack_ffffffffffffffa4;
  amqp_time_t in_stack_ffffffffffffffa8;
  
  do {
    while (aVar1 = amqp_data_in_buffer(in_RDI), aVar1 != 0) {
      iVar2 = consume_one_frame((amqp_connection_state_t)in_stack_ffffffffffffffa8.time_point_ns,
                                (amqp_frame_t *)
                                CONCAT44(in_stack_ffffffffffffffa4,
                                         CONCAT22(in_stack_ffffffffffffffa2,
                                                  CONCAT11(in_stack_ffffffffffffffa1,
                                                           in_stack_ffffffffffffffa0))));
      if (iVar2 != 0) {
        return iVar2;
      }
      if (*in_RSI == '\b') {
        amqp_maybe_release_buffers_on_channel
                  ((amqp_connection_state_t)
                   CONCAT44(in_stack_ffffffffffffffa4,
                            CONCAT22(in_stack_ffffffffffffffa2,
                                     CONCAT11(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0)))
                   ,(amqp_channel_t)(in_stack_ffffffffffffff98.time_point_ns >> 0x30));
      }
      else if (*in_RSI != '\0') {
        return 0;
      }
    }
    while( true ) {
      aVar3.time_point_ns._4_4_ = in_stack_ffffffffffffff8c;
      aVar3.time_point_ns._0_4_ = in_stack_ffffffffffffff88;
      iVar2 = amqp_time_has_past(aVar3);
      if (iVar2 == -0xe) {
        return -0xe;
      }
      if (iVar2 == -0xd) {
        in_stack_ffffffffffffffa2 = 0;
        in_stack_ffffffffffffffa0 = 8;
        iVar2 = amqp_send_frame((amqp_connection_state_t)
                                CONCAT44(in_stack_ffffffffffffffa4,
                                         (uint)CONCAT11(in_stack_ffffffffffffffa1,8)),
                                (amqp_frame_t *)in_stack_ffffffffffffff98.time_point_ns);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      aVar3 = amqp_time_first((in_RDI->next_recv_heartbeat).time_point_ns,
                              (in_RDI->next_send_heartbeat).time_point_ns);
      l = amqp_time_first(in_RDX,aVar3);
      in_stack_ffffffffffffff98 = l;
      iVar2 = recv_with_timeout((amqp_connection_state_t)
                                CONCAT44(in_stack_ffffffffffffffa4,
                                         CONCAT22(in_stack_ffffffffffffffa2,
                                                  CONCAT11(in_stack_ffffffffffffffa1,
                                                           in_stack_ffffffffffffffa0))),
                                in_stack_ffffffffffffffa8);
      if (iVar2 != -0xd) break;
      iVar2 = amqp_time_equal(l,(amqp_time_t)(in_RDI->next_recv_heartbeat).time_point_ns);
      if (iVar2 != 0) {
        amqp_socket_close((amqp_socket_t *)aVar3.time_point_ns,in_stack_ffffffffffffff8c);
        return -0xf;
      }
      iVar2 = amqp_time_equal(l,in_RDX);
      if (iVar2 != 0) {
        return -0xd;
      }
      iVar2 = amqp_time_equal(l,(amqp_time_t)(in_RDI->next_send_heartbeat).time_point_ns);
      if (iVar2 == 0) {
        amqp_abort("Internal error: unable to determine timeout reason");
      }
    }
    if (iVar2 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int wait_frame_inner(amqp_connection_state_t state,
                            amqp_frame_t *decoded_frame,
                            amqp_time_t timeout_deadline) {
  amqp_time_t deadline;
  int res;

  for (;;) {
    while (amqp_data_in_buffer(state)) {
      res = consume_one_frame(state, decoded_frame);

      if (AMQP_STATUS_OK != res) {
        return res;
      }

      if (AMQP_FRAME_HEARTBEAT == decoded_frame->frame_type) {
        amqp_maybe_release_buffers_on_channel(state, 0);
        continue;
      }

      if (decoded_frame->frame_type != 0) {
        /* Complete frame was read. Return it. */
        return AMQP_STATUS_OK;
      }
    }

  beginrecv:
    res = amqp_time_has_past(state->next_send_heartbeat);
    if (AMQP_STATUS_TIMER_FAILURE == res) {
      return res;
    } else if (AMQP_STATUS_TIMEOUT == res) {
      amqp_frame_t heartbeat;
      heartbeat.channel = 0;
      heartbeat.frame_type = AMQP_FRAME_HEARTBEAT;

      res = amqp_send_frame(state, &heartbeat);
      if (AMQP_STATUS_OK != res) {
        return res;
      }
    }
    deadline = amqp_time_first(timeout_deadline,
                               amqp_time_first(state->next_recv_heartbeat,
                                               state->next_send_heartbeat));

    /* TODO this needs to wait for a _frame_ and not anything written from the
     * socket */
    res = recv_with_timeout(state, deadline);

    if (AMQP_STATUS_TIMEOUT == res) {
      if (amqp_time_equal(deadline, state->next_recv_heartbeat)) {
        amqp_socket_close(state->socket, AMQP_SC_FORCE);
        return AMQP_STATUS_HEARTBEAT_TIMEOUT;
      } else if (amqp_time_equal(deadline, timeout_deadline)) {
        return AMQP_STATUS_TIMEOUT;
      } else if (amqp_time_equal(deadline, state->next_send_heartbeat)) {
        /* send heartbeat happens before we do recv_with_timeout */
        goto beginrecv;
      } else {
        amqp_abort("Internal error: unable to determine timeout reason");
      }
    } else if (AMQP_STATUS_OK != res) {
      return res;
    }
  }
}